

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void __thiscall CPP::WriteInitialization::acceptLayout(WriteInitialization *this,DomLayout *node)

{
  QStack<DomLayout_*> *this_00;
  qsizetype *pqVar1;
  QArrayData *pQVar2;
  long lVar3;
  Driver *this_01;
  char16_t *pcVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  Node<QString,_DomProperty_*> *pNVar9;
  DomProperty **ppDVar10;
  QTextStream *pQVar11;
  iterator iVar12;
  iterator iVar13;
  iterator iVar14;
  iterator iVar15;
  DomProperty *pDVar16;
  long lVar17;
  int marginType;
  long in_FS_OFFSET;
  bool bVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  DomProperty *p;
  DomPropertyMap properties;
  QString local_118;
  QString local_f8;
  QList<DomProperty_*> local_d8;
  QList<DomProperty_*> local_b8;
  DomPropertyMap local_a0;
  QString local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.d = (node->m_attr_class).d.d;
  local_78.d.ptr = (node->m_attr_class).d.ptr;
  local_78.d.size = (node->m_attr_class).d.size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  Driver::findOrInsertLayout(&local_98,this->m_driver,node);
  pQVar2 = &((node->m_property).d.d)->super_QArrayData;
  ppDVar10 = (node->m_property).d.ptr;
  lVar3 = (node->m_property).d.size;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a0.d = (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0;
  if (lVar3 != 0) {
    lVar17 = 0;
    do {
      local_b8.d.d = *(Data **)((long)ppDVar10 + lVar17);
      local_58.d.d = *(Data **)&(local_b8.d.d)->super_QArrayData;
      local_58.d.ptr = (char16_t *)((local_b8.d.d)->super_QArrayData).alloc;
      local_58.d.size._0_4_ = local_b8.d.d[1].super_QArrayData.ref_;
      local_58.d.size._4_4_ = local_b8.d.d[1].super_QArrayData.flags;
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QHash<QString,DomProperty*>::emplace<DomProperty*const&>
                ((QHash<QString,DomProperty*> *)&local_a0,&local_58,(DomProperty **)&local_b8);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar17 = lVar17 + 8;
    } while (lVar3 << 3 != lVar17);
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,0x10);
    }
  }
  local_58.d.d = (Data *)&DAT_00000006;
  local_58.d.ptr = L"margin";
  if ((local_a0.d == (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) ||
     (pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::
               findNode<QLatin1String>(local_a0.d,(QLatin1String *)&local_58),
     pNVar9 == (Node<QString,_DomProperty_*> *)0x0)) {
    ppDVar10 = (DomProperty **)0x0;
  }
  else {
    ppDVar10 = &pNVar9->value;
  }
  if (ppDVar10 == (DomProperty **)0x0) {
    bVar18 = true;
  }
  else {
    bVar18 = *ppDVar10 == (DomProperty *)0x0;
  }
  pQVar11 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,&local_98);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11," = ");
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&language::operatorNew);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,&local_78);
  QTextStream::operator<<(pQVar11,'(');
  this_00 = &this->m_layoutChain;
  iVar12 = QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  if (iVar12.i[-1] == (DomLayout *)0x0) {
    pQVar11 = this->m_output;
    this_01 = this->m_driver;
    iVar13 = QList<DomWidget_*>::end(&(this->m_widgetChain).super_QList<DomWidget_*>);
    Driver::findOrInsertWidget(&local_58,this_01,iVar13.i[-1]);
    QTextStream::operator<<(pQVar11,&local_58);
    if ((DomProperty *)local_58.d.d != (DomProperty *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar11 = (QTextStream *)QTextStream::operator<<(this->m_output,")");
  QTextStream::operator<<(pQVar11,(QString *)&language::eol);
  iVar12 = QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  marginType = 0;
  if (!bVar18) {
    marginType = this->m_layoutMarginType;
  }
  LayoutDefaultHandler::writeProperties
            (&this->m_LayoutDefaultHandler,&this->m_indent,&local_98,&local_a0,marginType,
             iVar12.i[-1] != (DomLayout *)0x0,this->m_output);
  this->m_layoutMarginType = 3;
  local_b8.d.d = (node->m_property).d.d;
  local_b8.d.ptr = (node->m_property).d.ptr;
  local_b8.d.size = (node->m_property).d.size;
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (DomProperty **)0x0;
  local_d8.d.size = 0;
  if (this->m_layoutWidget == true) {
    iVar14 = QList<DomProperty_*>::begin(&local_b8);
    iVar15 = QList<DomProperty_*>::end(&local_b8);
    if (iVar14.i == iVar15.i) {
      bVar8 = false;
      bVar6 = false;
      bVar5 = false;
      bVar18 = false;
    }
    else {
      bVar18 = false;
      bVar5 = false;
      bVar6 = false;
      bVar8 = false;
      do {
        pDVar16 = *iVar14.i;
        pQVar2 = &((pDVar16->m_attr_name).d.d)->super_QArrayData;
        pcVar4 = (pDVar16->m_attr_name).d.ptr;
        lVar3 = (pDVar16->m_attr_name).d.size;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        switch(lVar3) {
        case 9:
switchD_0012a5ee_caseD_9:
          QVar19.m_data = pcVar4;
          QVar19.m_size = lVar3;
          QVar32.m_data = "topMargin";
          QVar32.m_size = 9;
          cVar7 = QtPrivate::equalStrings(QVar19,QVar32);
          if ((cVar7 == '\0') || (pDVar16->m_kind != Number)) {
            if (lVar3 == 0xc) goto switchD_0012a5ee_caseD_c;
            if (lVar3 == 0xb) goto switchD_0012a5ee_caseD_b;
          }
          else {
            bVar5 = true;
          }
          break;
        case 10:
          QVar20.m_data = pcVar4;
          QVar20.m_size = lVar3;
          QVar33.m_data = "leftMargin";
          QVar33.m_size = 10;
          cVar7 = QtPrivate::equalStrings(QVar20,QVar33);
          if ((cVar7 == '\0') || (pDVar16->m_kind != Number)) {
            if (lVar3 == 0xc) goto switchD_0012a5ee_caseD_c;
            if (lVar3 == 0xb) goto switchD_0012a5ee_caseD_b;
            if (lVar3 == 9) goto switchD_0012a5ee_caseD_9;
          }
          else {
            bVar18 = true;
          }
          break;
        case 0xb:
switchD_0012a5ee_caseD_b:
          QVar21.m_data = pcVar4;
          QVar21.m_size = lVar3;
          QVar34.m_data = "rightMargin";
          QVar34.m_size = 0xb;
          cVar7 = QtPrivate::equalStrings(QVar21,QVar34);
          if ((cVar7 == '\0') || (pDVar16->m_kind != Number)) {
            if (lVar3 == 0xc) goto switchD_0012a5ee_caseD_c;
          }
          else {
            bVar6 = true;
          }
          break;
        case 0xc:
switchD_0012a5ee_caseD_c:
          QVar22.m_data = pcVar4;
          QVar22.m_size = lVar3;
          QVar35.m_data = "bottomMargin";
          QVar35.m_size = 0xc;
          cVar7 = QtPrivate::equalStrings(QVar22,QVar35);
          if ((cVar7 != '\0') && (pDVar16->m_kind == Number)) {
            bVar8 = true;
          }
        }
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        iVar14.i = iVar14.i + 1;
      } while (iVar14.i != iVar15.i);
    }
    if (!bVar18) {
      pDVar16 = (DomProperty *)operator_new(0x178);
      memset(pDVar16,0,0x178);
      QVar23.m_data = (storage_type *)0xa;
      QVar23.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar23);
      local_f8.d.d = local_58.d.d;
      local_f8.d.ptr = local_58.d.ptr;
      local_f8.d.size = local_58.d.size;
      QString::operator=((QString *)pDVar16,&local_f8);
      pDVar16->m_has_attr_name = true;
      if ((DomProperty *)local_f8.d.d != (DomProperty *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      DomProperty::setElementNumber(pDVar16,0);
      local_58.d.d = (Data *)pDVar16;
      QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                ((QPodArrayOps<DomProperty*> *)&local_d8,local_d8.d.size,(DomProperty **)&local_58);
      QList<DomProperty_*>::end(&local_d8);
    }
    if (!bVar5) {
      pDVar16 = (DomProperty *)operator_new(0x178);
      memset(pDVar16,0,0x178);
      QVar24.m_data = (storage_type *)0x9;
      QVar24.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar24);
      local_f8.d.d = local_58.d.d;
      local_f8.d.ptr = local_58.d.ptr;
      local_f8.d.size = local_58.d.size;
      QString::operator=((QString *)pDVar16,&local_f8);
      pDVar16->m_has_attr_name = true;
      if ((DomProperty *)local_f8.d.d != (DomProperty *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      DomProperty::setElementNumber(pDVar16,0);
      local_58.d.d = (Data *)pDVar16;
      QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                ((QPodArrayOps<DomProperty*> *)&local_d8,local_d8.d.size,(DomProperty **)&local_58);
      QList<DomProperty_*>::end(&local_d8);
    }
    if (!bVar6) {
      pDVar16 = (DomProperty *)operator_new(0x178);
      memset(pDVar16,0,0x178);
      QVar25.m_data = &DAT_0000000b;
      QVar25.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar25);
      local_f8.d.d = local_58.d.d;
      local_f8.d.ptr = local_58.d.ptr;
      local_f8.d.size = local_58.d.size;
      QString::operator=((QString *)pDVar16,&local_f8);
      pDVar16->m_has_attr_name = true;
      if ((DomProperty *)local_f8.d.d != (DomProperty *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      DomProperty::setElementNumber(pDVar16,0);
      local_58.d.d = (Data *)pDVar16;
      QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                ((QPodArrayOps<DomProperty*> *)&local_d8,local_d8.d.size,(DomProperty **)&local_58);
      QList<DomProperty_*>::end(&local_d8);
    }
    if (!bVar8) {
      pDVar16 = (DomProperty *)operator_new(0x178);
      memset(pDVar16,0,0x178);
      QVar26.m_data = (storage_type *)0xc;
      QVar26.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar26);
      local_f8.d.d = local_58.d.d;
      local_f8.d.ptr = local_58.d.ptr;
      local_f8.d.size = local_58.d.size;
      QString::operator=((QString *)pDVar16,&local_f8);
      pDVar16->m_has_attr_name = true;
      if ((DomProperty *)local_f8.d.d != (DomProperty *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      DomProperty::setElementNumber(pDVar16,0);
      local_58.d.d = (Data *)pDVar16;
      QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                ((QPodArrayOps<DomProperty*> *)&local_d8,local_d8.d.size,(DomProperty **)&local_58);
      QList<DomProperty_*>::end(&local_d8);
    }
    this->m_layoutWidget = false;
  }
  QtPrivate::QCommonArrayOps<DomProperty_*>::growAppend
            ((QCommonArrayOps<DomProperty_*> *)&local_b8,local_d8.d.ptr,
             local_d8.d.ptr + local_d8.d.size);
  writeProperties(this,&local_98,&local_78,&local_b8,3);
  QList<DomProperty_*>::clear(&local_b8);
  qDeleteAll<QList<DomProperty*>::const_iterator>
            ((const_iterator)local_d8.d.ptr,(const_iterator)(local_d8.d.ptr + local_d8.d.size));
  QList<DomProperty_*>::clear(&local_d8);
  local_58.d.d = (Data *)node;
  QtPrivate::QPodArrayOps<DomLayout*>::emplace<DomLayout*&>
            ((QPodArrayOps<DomLayout*> *)this_00,
             (this->m_layoutChain).super_QList<DomLayout_*>.d.size,(DomLayout **)&local_58);
  QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  TreeWalker::acceptLayout(&this->super_TreeWalker,node);
  QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  pqVar1 = &(this->m_layoutChain).super_QList<DomLayout_*>.d.size;
  *pqVar1 = *pqVar1 + -1;
  local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(&local_f8,(QChar)0x30);
  QVar27.m_data = (storage_type *)0xa;
  QVar27.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar27);
  local_118.d.d = local_58.d.d;
  local_118.d.ptr = local_58.d.ptr;
  local_118.d.size = local_58.d.size;
  local_58.d.d = (node->m_attr_stretch).d.d;
  local_58.d.ptr = (node->m_attr_stretch).d.ptr;
  local_58.d.size = (node->m_attr_stretch).d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,&local_98,&local_118,&local_58,&local_f8);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((DomLayout *)local_118.d.d != (DomLayout *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_118.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_118.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_118.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar28.m_data = &DAT_0000000d;
  QVar28.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar28);
  local_118.d.d = local_58.d.d;
  local_118.d.ptr = local_58.d.ptr;
  local_118.d.size = local_58.d.size;
  local_58.d.d = (node->m_attr_rowStretch).d.d;
  local_58.d.ptr = (node->m_attr_rowStretch).d.ptr;
  local_58.d.size = (node->m_attr_rowStretch).d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,&local_98,&local_118,&local_58,&local_f8);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar29.m_data = (storage_type *)0x10;
  QVar29.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar29);
  local_118.d.d = local_58.d.d;
  local_118.d.ptr = local_58.d.ptr;
  local_118.d.size = local_58.d.size;
  local_58.d.d = (node->m_attr_columnStretch).d.d;
  local_58.d.ptr = (node->m_attr_columnStretch).d.ptr;
  local_58.d.size = (node->m_attr_columnStretch).d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,&local_98,&local_118,&local_58,&local_f8);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar30.m_data = (storage_type *)0x15;
  QVar30.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar30);
  local_118.d.d = local_58.d.d;
  local_118.d.ptr = local_58.d.ptr;
  local_118.d.size = local_58.d.size;
  local_58.d.d = (node->m_attr_columnMinimumWidth).d.d;
  local_58.d.ptr = (node->m_attr_columnMinimumWidth).d.ptr;
  local_58.d.size = (node->m_attr_columnMinimumWidth).d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,&local_98,&local_118,&local_58,&local_f8);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar31.m_data = (storage_type *)0x13;
  QVar31.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar31);
  local_118.d.d = local_58.d.d;
  local_118.d.ptr = local_58.d.ptr;
  local_118.d.size = local_58.d.size;
  local_58.d.d = (node->m_attr_rowMinimumHeight).d.d;
  local_58.d.ptr = (node->m_attr_rowMinimumHeight).d.ptr;
  local_58.d.size = (node->m_attr_rowMinimumHeight).d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,&local_98,&local_118,&local_58,&local_f8);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,8,0x10);
    }
  }
  QHash<QString,_DomProperty_*>::~QHash(&local_a0);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::acceptLayout(DomLayout *node)
{
    const QString className = node->attributeClass();
    const QString varName = m_driver->findOrInsertLayout(node);

    const DomPropertyMap properties = propertyMap(node->elementProperty());
    const bool oldLayoutProperties = properties.value("margin"_L1) != nullptr;

    bool isGroupBox = false;

    m_output << m_indent << varName << " = " << language::operatorNew << className << '(';

    if (!m_layoutChain.top() && !isGroupBox)
        m_output << m_driver->findOrInsertWidget(m_widgetChain.top());

    m_output << ")" << language::eol;

    // Suppress margin on a read child layout
    const bool suppressMarginDefault = m_layoutChain.top();
    int marginType = Use43UiFile;
    if (oldLayoutProperties)
        marginType = m_layoutMarginType;
    m_LayoutDefaultHandler.writeProperties(m_indent, varName, properties, marginType, suppressMarginDefault, m_output);

    m_layoutMarginType = SubLayoutMargin;

    DomPropertyList propList = node->elementProperty();
    DomPropertyList newPropList;
    if (m_layoutWidget) {
        bool left = false;
        bool top = false;
        bool right = false;
        bool bottom = false;
        for (const DomProperty *p : propList) {
            const QString propertyName = p->attributeName();
            if (propertyName == "leftMargin"_L1 && p->kind() == DomProperty::Number)
                left = true;
            else if (propertyName == "topMargin"_L1 && p->kind() == DomProperty::Number)
                top = true;
            else if (propertyName == "rightMargin"_L1 && p->kind() == DomProperty::Number)
                right = true;
            else if (propertyName == "bottomMargin"_L1 && p->kind() == DomProperty::Number)
                bottom = true;
        }
        if (!left) {
            auto *p = new DomProperty();
            p->setAttributeName("leftMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!top) {
            auto *p = new DomProperty();
            p->setAttributeName("topMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!right) {
            auto *p = new DomProperty();
            p->setAttributeName("rightMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!bottom) {
            auto *p = new DomProperty();
            p->setAttributeName("bottomMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        m_layoutWidget = false;
    }

    propList.append(newPropList);

    writeProperties(varName, className, propList, WritePropertyIgnoreMargin|WritePropertyIgnoreSpacing);

    // Clean up again:
    propList.clear();
    qDeleteAll(newPropList);
    newPropList.clear();

    m_layoutChain.push(node);
    TreeWalker::acceptLayout(node);
    m_layoutChain.pop();

    // Stretch? (Unless we are compiling for UIC3)
    const QString numberNull(u'0');
    writePropertyList(varName, "setStretch"_L1, node->attributeStretch(), numberNull);
    writePropertyList(varName, "setRowStretch"_L1, node->attributeRowStretch(), numberNull);
    writePropertyList(varName, "setColumnStretch"_L1, node->attributeColumnStretch(), numberNull);
    writePropertyList(varName, "setColumnMinimumWidth"_L1, node->attributeColumnMinimumWidth(), numberNull);
    writePropertyList(varName, "setRowMinimumHeight"_L1, node->attributeRowMinimumHeight(), numberNull);
}